

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

CURLcode Curl_resolver_is_resolved(Curl_easy *data,Curl_dns_entry **entry)

{
  Curl_async *async;
  int iVar1;
  thread_data *ptVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLcode CVar5;
  uint uVar6;
  timediff_t tVar7;
  long lVar8;
  curltime cVar9;
  curltime newer;
  curltime older;
  
  ptVar2 = (data->state).async.tdata;
  *entry = (Curl_dns_entry *)0x0;
  if (ptVar2 == (thread_data *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock((pthread_mutex_t *)(ptVar2->tsd).mtx);
  iVar1 = (ptVar2->tsd).done;
  pthread_mutex_unlock((pthread_mutex_t *)(ptVar2->tsd).mtx);
  if (iVar1 != 0) {
    async = &(data->state).async;
    ptVar2 = (data->state).async.tdata;
    Curl_addrinfo_callback(data,(ptVar2->tsd).sock_error,(ptVar2->tsd).res);
    (ptVar2->tsd).res = (Curl_addrinfo *)0x0;
    if ((data->state).async.dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(async);
      *entry = (data->state).async.dns;
      return CURLE_OK;
    }
    CVar5 = Curl_resolver_error(data);
    destroy_async_data(async);
    return CVar5;
  }
  cVar9 = Curl_now();
  uVar3 = (data->progress).t_startsingle.tv_sec;
  uVar4 = (data->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar9._0_12_,0);
  newer.tv_usec = SUB124(cVar9._0_12_,8);
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  lVar8 = 0;
  if (0 < tVar7) {
    lVar8 = tVar7;
  }
  if (ptVar2->poll_interval == 0) {
    uVar6 = 1;
  }
  else {
    if (lVar8 < ptVar2->interval_end) goto LAB_00111c15;
    uVar6 = ptVar2->poll_interval * 2;
  }
  ptVar2->poll_interval = uVar6;
LAB_00111c15:
  if (0xfa < ptVar2->poll_interval) {
    ptVar2->poll_interval = 0xfa;
  }
  ptVar2->interval_end = lVar8 + (ulong)ptVar2->poll_interval;
  Curl_expire(data,(ulong)ptVar2->poll_interval,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct Curl_easy *data,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data *td = data->state.async.tdata;
  int done = 0;

  DEBUGASSERT(entry);
  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(data);

    if(!data->state.async.dns) {
      CURLcode result = Curl_resolver_error(data);
      destroy_async_data(&data->state.async);
      return result;
    }
    destroy_async_data(&data->state.async);
    *entry = data->state.async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    /* should be fine even if this converts to 32-bit */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}